

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  PFNGLBUFFERDATAPROC p_Var1;
  PFNGLUSEPROGRAMPROC p_Var2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  GLenum GVar6;
  ostream *poVar7;
  path *ppVar8;
  reference pvVar9;
  GLFWwindow *handle;
  Shader *pSVar10;
  size_type sVar11;
  pointer pvVar12;
  pointer pvVar13;
  rep_conflict rVar14;
  double *__rep;
  char **in_RCX;
  char *__to;
  char *__to_00;
  double local_2f0;
  double local_2e8;
  duration<float,_std::ratio<1L,_1000000000L>_> local_2dc;
  rep_conflict local_2d8;
  rep_conflict local_2d0;
  undefined4 local_2c4;
  type tStack_2c0;
  float OPTIMAL_TIME;
  type delta_time;
  time_point current_frame;
  time_point last_frame;
  path local_280;
  path local_258;
  path local_230;
  path local_208;
  path local_1e0;
  path local_1b8;
  path local_190;
  path local_168;
  path local_140;
  path local_118;
  path local_f0;
  undefined1 local_c8 [8];
  Shader shader_overlay;
  Shader shader_bezier;
  GLFWwindow *window;
  path shader_dir_path;
  undefined1 local_48 [8];
  optional<std::filesystem::__cxx11::path> maybe_shader_dir;
  char **argv_local;
  int argc_local;
  
  maybe_shader_dir.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
  super__Optional_payload_base<std::filesystem::__cxx11::path>._40_8_ = argv;
  (anonymous_namespace)::resrc::path::find_shader_folder_abi_cxx11_
            ((optional<std::filesystem::__cxx11::path> *)local_48,(path *)(ulong)(uint)argc,
             (int)argv,in_RCX);
  bVar3 = std::optional<std::filesystem::__cxx11::path>::has_value
                    ((optional<std::filesystem::__cxx11::path> *)local_48);
  if (!bVar3) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "Please specify shader directory, for example:\n\t");
    std::operator<<(poVar7,"$ ./bezier \"../src/shader/\"\n");
    exit(-1);
  }
  ppVar8 = std::optional<std::filesystem::__cxx11::path>::value
                     ((optional<std::filesystem::__cxx11::path> *)local_48);
  std::filesystem::__cxx11::path::path((path *)&window,ppVar8);
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,1);
  glfwWindowHint(0x22008,0x32001);
  pvVar9 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)(anonymous_namespace)::ws,0);
  iVar4 = *pvVar9;
  pvVar9 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)(anonymous_namespace)::ws,1);
  handle = glfwCreateWindow(iVar4,*pvVar9,"Bezier Curve with OpenGL Tessellation",(GLFWmonitor *)0x0
                            ,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"glfw window create failed");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    exit(-2);
  }
  glfwMakeContextCurrent(handle);
  iVar4 = gladLoadGLLoader(glfwGetProcAddress);
  if (iVar4 == 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,"GLAD init failed");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    exit(-3);
  }
  glfwSetMouseButtonCallback(handle,anon_unknown.dwarf_5da2::input::mouse_button_callback);
  glfwSetCursorPosCallback(handle,anon_unknown.dwarf_5da2::input::cursor_pos_callback);
  glfwSetKeyCallback(handle,anon_unknown.dwarf_5da2::input::key_callback);
  glfwSetFramebufferSizeCallback(handle,anon_unknown.dwarf_5da2::input::framebuffer_size_callback);
  Shader::Shader((Shader *)
                 &shader_overlay.createdShaders.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  Shader::Shader((Shader *)local_c8);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_118,(char (*) [12])"bezier.vert",auto_format);
  std::filesystem::__cxx11::operator/(&local_f0,(path *)&window,&local_118);
  pSVar10 = Shader::attach((Shader *)
                           &shader_overlay.createdShaders.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,&local_f0,0x8b31);
  std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
            (&local_168,(char (*) [16])"bezier.tcs.glsl",auto_format);
  std::filesystem::__cxx11::operator/(&local_140,(path *)&window,&local_168);
  pSVar10 = Shader::attach(pSVar10,&local_140,0x8e88);
  std::filesystem::__cxx11::path::path<char[16],std::filesystem::__cxx11::path>
            (&local_1b8,(char (*) [16])"bezier.tes.glsl",auto_format);
  std::filesystem::__cxx11::operator/(&local_190,(path *)&window,&local_1b8);
  pSVar10 = Shader::attach(pSVar10,&local_190,0x8e87);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_208,(char (*) [12])"bezier.frag",auto_format);
  std::filesystem::__cxx11::operator/(&local_1e0,(path *)&window,&local_208);
  ppVar8 = &local_1e0;
  pSVar10 = Shader::attach(pSVar10,ppVar8,0x8b30);
  Shader::link(pSVar10,(char *)ppVar8,__to);
  std::filesystem::__cxx11::path::~path(&local_1e0);
  std::filesystem::__cxx11::path::~path(&local_208);
  std::filesystem::__cxx11::path::~path(&local_190);
  std::filesystem::__cxx11::path::~path(&local_1b8);
  std::filesystem::__cxx11::path::~path(&local_140);
  std::filesystem::__cxx11::path::~path(&local_168);
  std::filesystem::__cxx11::path::~path(&local_f0);
  std::filesystem::__cxx11::path::~path(&local_118);
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_258,(char (*) [13])"overlay.vert",auto_format);
  std::filesystem::__cxx11::operator/(&local_230,(path *)&window,&local_258);
  pSVar10 = Shader::attach((Shader *)local_c8,&local_230,0x8b31);
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            ((path *)&last_frame,(char (*) [13])"overlay.frag",auto_format);
  std::filesystem::__cxx11::operator/(&local_280,(path *)&window,(path *)&last_frame);
  ppVar8 = &local_280;
  pSVar10 = Shader::attach(pSVar10,ppVar8,0x8b30);
  Shader::link(pSVar10,(char *)ppVar8,__to_00);
  std::filesystem::__cxx11::path::~path(&local_280);
  std::filesystem::__cxx11::path::~path((path *)&last_frame);
  std::filesystem::__cxx11::path::~path(&local_230);
  std::filesystem::__cxx11::path::~path(&local_258);
  (*glad_glPatchParameteri)(0x8e72,4);
  p_Var2 = glad_glUseProgram;
  GVar5 = Shader::id((Shader *)
                     &shader_overlay.createdShaders.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  (*p_Var2)(GVar5);
  (*glad_glGenVertexArrays)(1,(GLuint *)((anonymous_namespace)::ws + 0x60));
  (*glad_glBindVertexArray)((anonymous_namespace)::ws._96_4_);
  (*glad_glGenBuffers)(1,(GLuint *)((anonymous_namespace)::ws + 0x68));
  (*glad_glBindBuffer)(0x8892,(anonymous_namespace)::ws._104_4_);
  p_Var1 = glad_glBufferData;
  sVar11 = std::array<std::array<float,_2UL>,_4UL>::size
                     ((array<std::array<float,_2UL>,_4UL> *)((anonymous_namespace)::ws + 0x10));
  pvVar12 = std::array<std::array<float,_2UL>,_4UL>::data
                      ((array<std::array<float,_2UL>,_4UL> *)((anonymous_namespace)::ws + 0x10));
  (*p_Var1)(0x8892,sVar11 << 3,pvVar12,0x88e8);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
  p_Var2 = glad_glUseProgram;
  GVar5 = Shader::id((Shader *)local_c8);
  (*p_Var2)(GVar5);
  (*glad_glGenVertexArrays)(1,(GLuint *)((anonymous_namespace)::ws + 100));
  (*glad_glBindVertexArray)((anonymous_namespace)::ws._100_4_);
  (*glad_glBindBuffer)(0x8892,(anonymous_namespace)::ws._104_4_);
  (*glad_glEnableVertexAttribArray)(0);
  (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0,(void *)0x0);
  (*glad_glGenBuffers)(1,(GLuint *)((anonymous_namespace)::ws + 0x6c));
  (*glad_glBindBuffer)(0x8892,(anonymous_namespace)::ws._108_4_);
  p_Var1 = glad_glBufferData;
  sVar11 = std::array<std::array<float,_3UL>,_4UL>::size
                     ((array<std::array<float,_3UL>,_4UL> *)((anonymous_namespace)::ws + 0x30));
  pvVar13 = std::array<std::array<float,_3UL>,_4UL>::data
                      ((array<std::array<float,_3UL>,_4UL> *)((anonymous_namespace)::ws + 0x30));
  (*p_Var1)(0x8892,sVar11 * 0xc,pvVar13,0x88e4);
  (*glad_glEnableVertexAttribArray)(1);
  (*glad_glVertexAttribPointer)(1,3,0x1406,'\0',0,(void *)0x0);
  (*glad_glLineWidth)(1.0);
  (*glad_glPointSize)(10.0);
  (*glad_glClearColor)(0.227451,0.227451,0.227451,1.0);
  poVar7 = std::operator<<((ostream *)&std::cout,"Before render-loop: GLerror = ");
  GVar6 = (*glad_glGetError)();
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,GVar6);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  current_frame.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  delta_time.__r = std::chrono::_V2::system_clock::now();
  tStack_2c0 = std::chrono::operator-
                         ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)&delta_time,&current_frame);
  local_2c4 = 0x4b7e502b;
  do {
    (*glad_glClear)(0x4000);
    p_Var2 = glad_glUseProgram;
    GVar5 = Shader::id((Shader *)
                       &shader_overlay.createdShaders.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    (*p_Var2)(GVar5);
    (*glad_glBindVertexArray)((anonymous_namespace)::ws._96_4_);
    (*glad_glDrawArrays)(0xe,0,4);
    p_Var2 = glad_glUseProgram;
    GVar5 = Shader::id((Shader *)local_c8);
    (*p_Var2)(GVar5);
    (*glad_glBindVertexArray)((anonymous_namespace)::ws._100_4_);
    (*glad_glDrawArrays)(0,0,4);
    glfwSwapBuffers(handle);
    glfwPollEvents();
    local_2d0 = std::chrono::_V2::system_clock::now();
    delta_time.__r = local_2d0;
    local_2d8 = (rep_conflict)
                std::chrono::operator-
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&delta_time,&current_frame);
    current_frame.__d.__r = (duration)(duration)delta_time.__r;
    local_2e8 = 0.0;
    tStack_2c0 = (type)local_2d8;
    rVar14 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                       (&stack0xfffffffffffffd40);
    local_2f0 = (double)rVar14 * -1e-09 + 16666667.0;
    __rep = std::max<double>(&local_2e8,&local_2f0);
    std::chrono::duration<float,std::ratio<1l,1000000000l>>::duration<double,void>
              ((duration<float,std::ratio<1l,1000000000l>> *)&local_2dc,__rep);
    std::this_thread::sleep_for<float,std::ratio<1l,1000000000l>>(&local_2dc);
    iVar4 = glfwWindowShouldClose(handle);
  } while (iVar4 == 0);
  (*glad_glDeleteVertexArrays)(1,(GLuint *)((anonymous_namespace)::ws + 0x60));
  (*glad_glDeleteVertexArrays)(1,(GLuint *)((anonymous_namespace)::ws + 100));
  (*glad_glDeleteBuffers)(1,(GLuint *)((anonymous_namespace)::ws + 0x68));
  (*glad_glDeleteBuffers)(1,(GLuint *)((anonymous_namespace)::ws + 0x6c));
  Shader::destroy((Shader *)
                  &shader_overlay.createdShaders.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  glfwDestroyWindow(handle);
  glfwTerminate();
  poVar7 = std::operator<<((ostream *)&std::cout,"After cleanup: GLerror = ");
  GVar6 = (*glad_glGetError)();
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,GVar6);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  Shader::~Shader((Shader *)local_c8);
  Shader::~Shader((Shader *)
                  &shader_overlay.createdShaders.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::filesystem::__cxx11::path::~path((path *)&window);
  std::optional<std::filesystem::__cxx11::path>::~optional
            ((optional<std::filesystem::__cxx11::path> *)local_48);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  using namespace std::string_literals;

  auto maybe_shader_dir = resrc::path::find_shader_folder(argc, argv);
  if (!maybe_shader_dir.has_value()) {
    std::cout << "Please specify shader directory, for example:\n\t"
              << "$ ./bezier \"../src/shader/\"\n";
    exit(-1);
  }
  const auto shader_dir_path = maybe_shader_dir.value();

  // std::setlocale(LC_ALL, "POSIX");

  // Init glfw
  glfwInit();
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 1);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

  // Get window from glfw + init GLAD
  auto window = glfwCreateWindow(ws.win_sz[0], ws.win_sz[1],
                                 "Bezier Curve with OpenGL Tessellation",
                                 nullptr, nullptr);
  if (window == nullptr) {
    std::cerr << "glfw window create failed" << std::endl;
    exit(-2);
  }
  glfwMakeContextCurrent(window);
  if (!gladLoadGLLoader(GLADloadproc(glfwGetProcAddress))) {
    std::cerr << "GLAD init failed" << std::endl;
    exit(-3);
  }

  // Handle inputs
  glfwSetMouseButtonCallback(window, input::mouse_button_callback);
  glfwSetCursorPosCallback(window, input::cursor_pos_callback);
  glfwSetKeyCallback(window, input::key_callback);
  glfwSetFramebufferSizeCallback(window, input::framebuffer_size_callback);

  Shader shader_bezier, shader_overlay;
  shader_bezier //
      .attach(shader_dir_path / "bezier.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "bezier.tcs.glsl", GL_TESS_CONTROL_SHADER)
      .attach(shader_dir_path / "bezier.tes.glsl", GL_TESS_EVALUATION_SHADER)
      .attach(shader_dir_path / "bezier.frag", GL_FRAGMENT_SHADER)
      .link();
  shader_overlay //
      .attach(shader_dir_path / "overlay.vert", GL_VERTEX_SHADER)
      .attach(shader_dir_path / "overlay.frag", GL_FRAGMENT_SHADER)
      .link();

  // bezier shader
  glPatchParameteri(GL_PATCH_VERTICES, 4);
  glUseProgram(shader_bezier.id());
  glGenVertexArrays(1, &ws.VAO_bezier);
  glBindVertexArray(ws.VAO_bezier);

  // Vertex positions
  glGenBuffers(1, &ws.VBO_pos);

  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V2f) * ws.point_pos.size(),
               ws.point_pos.data(), GL_DYNAMIC_DRAW);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);

  // overlay shader
  glUseProgram(shader_overlay.id());
  glGenVertexArrays(1, &ws.VAO_overlay);
  glBindVertexArray(ws.VAO_overlay);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_pos);
  glEnableVertexAttribArray(0);
  glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, nullptr);
  glGenBuffers(1, &ws.VBO_color);
  glBindBuffer(GL_ARRAY_BUFFER, ws.VBO_color);
  glBufferData(GL_ARRAY_BUFFER, sizeof(V3f) * ws.point_color.size(),
               ws.point_color.data(), GL_STATIC_DRAW);
  glEnableVertexAttribArray(1);
  glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 0, nullptr);

  glLineWidth(gl_line_width);
  glPointSize(gl_point_size);
  glClearColor(gray, gray, gray, 1.0f);

  std::cout << "Before render-loop: GLerror = " << glGetError() << std::endl;

  auto last_frame = std::chrono::high_resolution_clock::now();
  auto current_frame = std::chrono::high_resolution_clock::now();
  auto delta_time = current_frame - last_frame;
  constexpr float OPTIMAL_TIME = 1e9 / TARGET_FPS;

  do { /* Main render loop */
    glClear(GL_COLOR_BUFFER_BIT);
    glUseProgram(shader_bezier.id());
    glBindVertexArray(ws.VAO_bezier);
    glDrawArrays(GL_PATCHES, 0, 4);

    glUseProgram(shader_overlay.id());
    glBindVertexArray(ws.VAO_overlay);
    glDrawArrays(GL_POINTS, 0, 4);

    glfwSwapBuffers(window);
    glfwPollEvents();

    current_frame = std::chrono::high_resolution_clock::now();
    delta_time = current_frame - last_frame;
    last_frame = current_frame;

    std::this_thread::sleep_for(std::chrono::duration<float, std::nano>(
        std::max(0.0, OPTIMAL_TIME - delta_time.count() * 1e-9)));
  } while (!glfwWindowShouldClose(window));

  /* CLEAN-UP */
  glDeleteVertexArrays(1, &ws.VAO_bezier);
  glDeleteVertexArrays(1, &ws.VAO_overlay);
  glDeleteBuffers(1, &ws.VBO_pos);
  glDeleteBuffers(1, &ws.VBO_color);
  shader_bezier.destroy();
  glfwDestroyWindow(window);
  glfwTerminate();

  std::cout << "After cleanup: GLerror = " << glGetError() << std::endl;
}